

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O1

void __thiscall bdNodeManager::stopDht(bdNodeManager *this)

{
  stopDht((bdNodeManager *)&this[-1].super_bdNode.mConnMgr);
  return;
}

Assistant:

int	bdNodeManager::stopDht() {
	time_t now = time(NULL);

	/* clean up node */
	shutdownNode();

	/* flag queries as inactive */
	/* check if exists already */
	std::map<bdNodeId, bdQueryPeer>::iterator it;	
	for (it = mActivePeers.begin(); it != mActivePeers.end(); it++)
		it->second.mStatus = BITDHT_QUERY_READY;

	/* set state flag */
	mMode = BITDHT_MGR_STATE_OFF;
	mModeTS = now;

	return 1;
}